

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemTable.cpp
# Opt level: O2

string * __thiscall MemTable::get_abi_cxx11_(MemTable *this,longlong k)

{
  LevelIter level;
  Result RVar1;
  
  level._M_node =
       (this->qlist).
       super__List_base<QuadList<SSTableDataEntry>,_std::allocator<QuadList<SSTableDataEntry>_>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  if (level._M_node != (_List_node_base *)&this->qlist) {
    RVar1 = skipSearch(this,level,k);
    if (((RVar1.node)->data).key == k) {
      if (((undefined1  [16])RVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return (string *)0x0;
      }
      return &((RVar1.node)->data).value;
    }
  }
  return (string *)0x0;
}

Assistant:

std::string *MemTable::get(long long k) {
    if (qlist.empty()) return nullptr;
    auto[valid, res] = skipSearch(qlist.begin(), k);
    return res->data.key == k && valid ? &(res->data.value) : nullptr;
}